

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool function_float_round(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_value_t value;
  gravity_class_t *pgVar1;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar2;
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  pgVar1 = gravity_class_float;
  aVar2.f = round((args->field_1).f);
  value.field_1.n = aVar2.n;
  value.isa = pgVar1;
  gravity_vm_setslot(vm,value,rindex);
  return true;
}

Assistant:

static bool function_float_round (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm, nargs)

    #if GRAVITY_ENABLE_DOUBLE
    RETURN_VALUE(VALUE_FROM_FLOAT(round(GET_VALUE(0).f)), rindex);
    #else
    RETURN_VALUE(VALUE_FROM_FLOAT(roundf(GET_VALUE(0).f)), rindex);
    #endif
}